

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImVec2 *rhs;
  ImVec2 *uv_min;
  ImVec2 *uv_max;
  ImFontAtlas *this;
  ImTextureID pvVar1;
  bool bVar2;
  ImVec2 *local_110;
  bool local_101;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImTextureID local_70;
  ImTextureID tex_id;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas_conflict *font_atlas;
  ImU32 col_shadow_local;
  ImU32 col_border_local;
  ImU32 col_fill_local;
  ImGuiMouseCursor mouse_cursor_local;
  float scale_local;
  ImDrawList *draw_list_local;
  ImVec2 pos_local;
  
  if (mouse_cursor != -1) {
    local_101 = 8 < (uint)mouse_cursor;
    draw_list_local = (ImDrawList *)pos;
    if (local_101) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xedc,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    this = draw_list->_Data->Font->ContainerAtlas;
    ImVec2::ImVec2(&size);
    ImVec2::ImVec2(uv + 3);
    local_110 = (ImVec2 *)&tex_id;
    do {
      ImVec2::ImVec2(local_110);
      local_110 = local_110 + 1;
    } while (local_110 != uv + 3);
    bVar2 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&size,uv + 3,(ImVec2 *)&tex_id,uv + 1);
    if (bVar2) {
      operator-=((ImVec2 *)&draw_list_local,&size);
      local_70 = this->TexID;
      ImDrawList::PushTextureID(draw_list,local_70);
      pvVar1 = local_70;
      ImVec2::ImVec2(&local_88,1.0,0.0);
      local_80 = operator*(&local_88,scale);
      local_78 = operator+((ImVec2 *)&draw_list_local,&local_80);
      ImVec2::ImVec2(&local_a8,1.0,0.0);
      rhs = uv + 3;
      local_a0 = operator+(&local_a8,rhs);
      local_98 = operator*(&local_a0,scale);
      local_90 = operator+((ImVec2 *)&draw_list_local,&local_98);
      uv_min = uv + 1;
      uv_max = uv + 2;
      ImDrawList::AddImage(draw_list,pvVar1,&local_78,&local_90,uv_min,uv_max,col_shadow);
      pvVar1 = local_70;
      ImVec2::ImVec2(&local_c0,2.0,0.0);
      local_b8 = operator*(&local_c0,scale);
      local_b0 = operator+((ImVec2 *)&draw_list_local,&local_b8);
      ImVec2::ImVec2(&local_e0,2.0,0.0);
      local_d8 = operator+(&local_e0,rhs);
      local_d0 = operator*(&local_d8,scale);
      local_c8 = operator+((ImVec2 *)&draw_list_local,&local_d0);
      ImDrawList::AddImage(draw_list,pvVar1,&local_b0,&local_c8,uv_min,uv_max,col_shadow);
      pvVar1 = local_70;
      local_f0 = operator*(rhs,scale);
      local_e8 = operator+((ImVec2 *)&draw_list_local,&local_f0);
      ImDrawList::AddImage
                (draw_list,pvVar1,(ImVec2 *)&draw_list_local,&local_e8,uv_min,uv_max,col_border);
      pvVar1 = local_70;
      local_100 = operator*(rhs,scale);
      local_f8 = operator+((ImVec2 *)&draw_list_local,&local_100);
      ImDrawList::AddImage
                (draw_list,pvVar1,(ImVec2 *)&draw_list_local,&local_f8,(ImVec2 *)&tex_id,uv,col_fill
                );
      ImDrawList::PopTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}